

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_name.c
# Opt level: O0

int X509_NAME_print(BIO *bp,X509_NAME *name,int obase)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *ptr;
  char *file;
  int i;
  int l;
  char *b;
  char *c;
  char *s;
  char *local_28;
  int local_4;
  
  iVar1 = 0x4e - obase;
  ptr = X509_NAME_oneline(name,(char *)0x0,0);
  if (ptr == (char *)0x0) {
    local_4 = 0;
  }
  else if (*ptr == '\0') {
    CRYPTO_free(ptr);
    local_4 = 1;
  }
  else {
    file = ptr + 1;
    local_28 = file;
    while( true ) {
      if ((((*local_28 == '/') && (iVar2 = ossl_ctype_check((int)local_28[1],2), iVar2 != 0)) &&
          ((local_28[2] == '=' ||
           ((iVar2 = ossl_ctype_check((int)local_28[2],2), iVar2 != 0 && (local_28[3] == '='))))))
         || (*local_28 == '\0')) {
        iVar2 = (int)local_28 - (int)file;
        iVar3 = BIO_write(bp,file,iVar2);
        if ((iVar3 != iVar2) ||
           ((file = local_28 + 1, *local_28 != '\0' && (iVar3 = BIO_write(bp,", ",2), iVar3 != 2))))
        {
          ERR_new();
          ERR_set_debug(file,(int)((ulong)ptr >> 0x20),(char *)CONCAT44(iVar1,iVar2));
          ERR_set_error(0xb,0x80007,(char *)0x0);
          CRYPTO_free(ptr);
          return 0;
        }
        iVar1 = iVar1 + -1;
      }
      if (*local_28 == '\0') break;
      local_28 = local_28 + 1;
      iVar1 = iVar1 + -1;
    }
    CRYPTO_free(ptr);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int X509_NAME_print(BIO *bp, const X509_NAME *name, int obase)
{
    char *s, *c, *b;
    int l, i;

    l = 80 - 2 - obase;

    b = X509_NAME_oneline(name, NULL, 0);
    if (b == NULL)
        return 0;
    if (*b == '\0') {
        OPENSSL_free(b);
        return 1;
    }
    s = b + 1;                  /* skip the first slash */

    c = s;
    for (;;) {
        if (((*s == '/') &&
             (ossl_isupper(s[1]) && ((s[2] == '=') ||
                                (ossl_isupper(s[2]) && (s[3] == '='))
              ))) || (*s == '\0'))
        {
            i = s - c;
            if (BIO_write(bp, c, i) != i)
                goto err;
            c = s + 1;          /* skip following slash */
            if (*s != '\0') {
                if (BIO_write(bp, ", ", 2) != 2)
                    goto err;
            }
            l--;
        }
        if (*s == '\0')
            break;
        s++;
        l--;
    }

    OPENSSL_free(b);
    return 1;
 err:
    ERR_raise(ERR_LIB_X509, ERR_R_BUF_LIB);
    OPENSSL_free(b);
    return 0;
}